

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

bool __thiscall qpdf::Array::insert(Array *this,int at,QPDFObjectHandle *item)

{
  element_type *peVar1;
  element_type *peVar2;
  QPDF *pQVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pQVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDF_Array *pQVar6;
  QPDF_Array *pQVar7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  logic_error *this_01;
  int iVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var11;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_> __tmp;
  int key;
  node_type nh;
  _Rb_tree_color local_80;
  int local_7c;
  node_type local_78;
  QPDFObjectHandle *local_60;
  insert_return_type local_58;
  
  local_7c = at;
  pQVar6 = array(this);
  pQVar7 = array(this);
  _Var11._M_head_impl =
       (pQVar7->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var11._M_head_impl == (Sparse *)0x0) {
    iVar10 = (int)((ulong)((long)(pQVar7->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pQVar7->elements).
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  else {
    iVar10 = (_Var11._M_head_impl)->size;
  }
  if (at <= iVar10 && -1 < at) {
    if (iVar10 == at) {
      push_back(this,item);
    }
    else {
      peVar1 = (item->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_01,"Attempting to add an uninitialized object to a QPDF_Array.");
LAB_001fb564:
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      peVar2 = (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (pQVar3 = peVar2->qpdf, pQVar3 != (QPDF *)0x0)) {
        if (pQVar3 != peVar1->qpdf && peVar1->qpdf != (QPDF *)0x0) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_01,
                     "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
                    );
          goto LAB_001fb564;
        }
      }
      _Var11._M_head_impl =
           (pQVar6->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var11._M_head_impl == (Sparse *)0x0) {
        pQVar5 = (pQVar6->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_78._M_pkey =
             (__pointer<int>)
             (item->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count +
                 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count +
                 1;
          }
        }
        local_78.
        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
        ._M_ptr = (pointer)peVar1;
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_insert_rval
                  (&pQVar6->elements,pQVar5 + (uint)at,(value_type *)&local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey);
        }
      }
      else {
        p_Var8 = (_Base_ptr)((long)&(_Var11._M_head_impl)->elements + 8);
        local_60 = item;
        if (p_Var8 != *(_Base_ptr *)((long)&(_Var11._M_head_impl)->elements + 0x18)) {
          do {
            p_Var8 = (_Base_ptr)std::_Rb_tree_decrement(p_Var8);
            local_80 = p_Var8[1]._M_color;
            if ((int)local_80 < at) break;
            std::
            _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
            ::extract(&local_78,&((_Var11._M_head_impl)->elements)._M_t,(key_type *)&local_80);
            *local_78._M_pkey = *local_78._M_pkey + 1;
            std::
            _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
            ::_M_reinsert_node_unique
                      (&local_58,
                       &(((pQVar6->sp)._M_t.
                          super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                          .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->
                        elements)._M_t,&local_78);
            if (local_58.node.
                super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                ._M_ptr != (pointer)0x0) {
              std::
              _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
              ::_M_reset(&local_58.node.
                          super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                        );
            }
            if (local_78.
                super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                ._M_ptr != (pointer)0x0) {
              std::
              _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
              ::_M_reset(&local_78.
                          super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                        );
            }
            _Var11._M_head_impl =
                 (pQVar6->sp)._M_t.
                 super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                 .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
          } while (p_Var8 != *(_Base_ptr *)((long)&(_Var11._M_head_impl)->elements + 0x18));
        }
        peVar1 = (local_60->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var4 = (local_60->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
            _Var11._M_head_impl =
                 (pQVar6->sp)._M_t.
                 super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                 .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        pmVar9 = std::
                 map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                 ::operator[](&(_Var11._M_head_impl)->elements,&local_7c);
        (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar1;
        this_00 = (pmVar9->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        _Var11._M_head_impl =
             (pQVar6->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        (_Var11._M_head_impl)->size = (_Var11._M_head_impl)->size + 1;
      }
    }
  }
  return at <= iVar10 && -1 < at;
}

Assistant:

bool
Array::insert(int at, QPDFObjectHandle const& item)
{
    auto a = array();
    int sz = size();
    if (at < 0 || at > sz) {
        // As special case, also allow insert beyond the end
        return false;
    } else if (at == sz) {
        push_back(item);
    } else {
        checkOwnership(item);
        if (a->sp) {
            auto iter = a->sp->elements.crbegin();
            while (iter != a->sp->elements.crend()) {
                auto key = (iter++)->first;
                if (key >= at) {
                    auto nh = a->sp->elements.extract(key);
                    ++nh.key();
                    a->sp->elements.insert(std::move(nh));
                } else {
                    break;
                }
            }
            a->sp->elements[at] = item.getObj();
            ++a->sp->size;
        } else {
            a->elements.insert(a->elements.cbegin() + at, item.getObj());
        }
    }
    return true;
}